

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniform_dist.hpp
# Opt level: O0

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,param_type *P)

{
  bool bVar1;
  _Ios_Fmtflags _Var2;
  basic_istream<char,_std::char_traits<char>_> *this;
  basic_istream<char,_std::char_traits<char>_> *pbVar3;
  undefined8 *in_RSI;
  basic_istream<char,_std::char_traits<char>_> *in_RDI;
  fmtflags flags;
  float b;
  float a;
  delim_c *in_stack_ffffffffffffffa8;
  param_type local_2c;
  char local_1f;
  char local_1e;
  char local_1d;
  fmtflags local_1c;
  result_type_conflict1 local_18;
  result_type_conflict1 local_14;
  undefined8 *local_10;
  basic_istream<char,_std::char_traits<char>_> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_1c = Catch::clara::std::ios_base::flags
                       ((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
  this = local_8 + *(long *)(*(long *)local_8 + -0x18);
  _Var2 = Catch::clara::std::operator|(_S_dec,_S_fixed);
  _Var2 = Catch::clara::std::operator|(_Var2,_S_left);
  Catch::clara::std::ios_base::flags((ios_base *)this,_Var2);
  local_1d = (char)utility::delim('\0');
  pbVar3 = utility::operator>>(this,in_stack_ffffffffffffffa8);
  std::istream::operator>>((istream *)pbVar3,&local_14);
  local_1e = (char)utility::delim('\0');
  pbVar3 = utility::operator>>(this,in_stack_ffffffffffffffa8);
  std::istream::operator>>((istream *)pbVar3,&local_18);
  local_1f = (char)utility::delim('\0');
  utility::operator>>(this,in_stack_ffffffffffffffa8);
  bVar1 = std::ios::operator_cast_to_bool((ios *)(local_8 + *(long *)(*(long *)local_8 + -0x18)));
  if (bVar1) {
    uniform_dist<float>::param_type::param_type(&local_2c,local_14,local_18);
    *local_10 = local_2c._0_8_;
    *(result_type_conflict1 *)(local_10 + 1) = local_2c.d_;
  }
  Catch::clara::std::ios_base::flags
            ((ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18)),local_1c);
  return local_8;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
          std::basic_istream<char_t, traits_t> &in, param_type &P) {
        float_t a, b;
        std::ios_base::fmtflags flags(in.flags());
        in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        in >> utility::delim('(') >> a >> utility::delim(' ') >> b >> utility::delim(')');
        if (in)
          P = param_type(a, b);
        in.flags(flags);
        return in;
      }